

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

cx_string<17UL> * __thiscall
mserialize::cx_strcat<17ul>
          (cx_string<17UL> *__return_storage_ptr__,mserialize *this,cx_string<17UL> *strings)

{
  char *pcVar1;
  bool bVar2;
  size_t s;
  long lVar3;
  char buffer [18];
  char local_28 [32];
  
  pcVar1 = local_28;
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  local_28[8] = '\0';
  local_28[9] = '\0';
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0xc] = '\0';
  local_28[0xd] = '\0';
  local_28[0xe] = '\0';
  local_28[0xf] = '\0';
  local_28[0x10] = '\0';
  local_28[0x11] = '\0';
  bVar2 = true;
  while (bVar2) {
    for (lVar3 = 0; lVar3 != 0x11; lVar3 = lVar3 + 1) {
      *(mserialize *)(pcVar1 + lVar3) = this[lVar3];
    }
    pcVar1 = pcVar1 + 0x11;
    bVar2 = false;
  }
  cx_string<17UL>::cx_string(__return_storage_ptr__,local_28);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}